

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cc
# Opt level: O2

void __thiscall mcc::TypeChecker::Visit(TypeChecker *this,Access *access)

{
  shared_ptr<mcc::Token> *token;
  element_type *peVar1;
  ErrorReporter *pEVar2;
  bool bVar3;
  TokenType TVar4;
  int iVar5;
  Entry *pEVar6;
  allocator<char> local_51;
  shared_ptr<mcc::Expr> local_50;
  string local_40;
  
  peVar1 = (access->name_).super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar1->return_ptr_ = true;
  (*peVar1->_vptr_Expr[2])(peVar1,this);
  bVar3 = Type::IsStruct(&((access->name_).super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->type_);
  if (!bVar3) {
    bVar3 = Type::IsUnion(&((access->name_).
                            super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type_
                         );
    if (!bVar3) {
      pEVar2 = this->reporter_;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,
                 "Only struct/union fields can be accessed via \'.\' or \'->\' operator",
                 (allocator<char> *)&local_50);
      ErrorReporter::Report(pEVar2,&local_40,&(access->super_Expr).op_);
      std::__cxx11::string::~string((string *)&local_40);
    }
  }
  token = &(access->super_Expr).op_;
  TVar4 = ((access->super_Expr).op_.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->token_type_;
  if (TVar4 == T_DOT) {
    if ((((access->name_).super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type_).
        ind == 0) goto LAB_00123dac;
    pEVar2 = this->reporter_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Struct variable expected, but got pointer",
               (allocator<char> *)&local_50);
    ErrorReporter::Report(pEVar2,&local_40,token);
    std::__cxx11::string::~string((string *)&local_40);
    TVar4 = ((token->super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            token_type_;
  }
  if ((TVar4 == T_ARROW) &&
     ((((access->name_).super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type_).
      ind != 1)) {
    pEVar2 = this->reporter_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Pointer to struct expected",(allocator<char> *)&local_50);
    ErrorReporter::Report(pEVar2,&local_40,token);
    std::__cxx11::string::~string((string *)&local_40);
  }
LAB_00123dac:
  iVar5 = (*((access->field_).super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_Expr[3])();
  if ((char)iVar5 == '\0') {
    pEVar2 = this->reporter_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Only string fields are supported",(allocator<char> *)&local_50);
    ErrorReporter::Report
              (pEVar2,&local_40,
               &((access->field_).super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->op_);
    std::__cxx11::string::~string((string *)&local_40);
  }
  (access->super_Expr).is_lvalue_ = true;
  std::static_pointer_cast<mcc::Literal,mcc::Expr>(&local_50);
  pEVar6 = SymbolTable::GetField
                     (this->symbol_table_,
                      &((access->name_).super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->type_,
                      &(((local_50.super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->op_).super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       identifier_);
  if (pEVar6 == (Entry *)0x0) {
    pEVar2 = this->reporter_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Undefined field",&local_51);
    ErrorReporter::Report
              (pEVar2,&local_40,
               &(local_50.super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->op_);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    Type::operator=(&(access->super_Expr).type_,pEVar6->type);
    Type::operator=(&(local_50.super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     type_,pEVar6->type);
    (local_50.super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->offset_ =
         pEVar6->offset;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_50.super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void TypeChecker::Visit(Access& access) {
  access.name_->return_ptr_ = true;
  access.name_->Accept(*this);

  if (!access.name_->type_.IsStruct() && !access.name_->type_.IsUnion()) {
    reporter_.Report("Only struct/union fields can be accessed via '.' or '->' operator", access.op_);
  }

  if (access.op_->GetType() == TokenType::T_DOT && access.name_->type_.ind != 0) {
    reporter_.Report("Struct variable expected, but got pointer", access.op_);
  }

  if (access.op_->GetType() == TokenType::T_ARROW && access.name_->type_.ind != 1) {
    reporter_.Report("Pointer to struct expected", access.op_);
  }

  if (!access.field_->IsVariable()) {
    reporter_.Report("Only string fields are supported", access.field_->op_);
  }

  access.is_lvalue_ = true;
  const std::shared_ptr<Literal>& field = std::static_pointer_cast<Literal>(access.field_);
  Entry* field_ = symbol_table_.GetField(access.name_->type_, field->op_->String());

  if (field_ == nullptr) {
    reporter_.Report("Undefined field", field->op_);
    return;
  }

  access.type_ = *field_->type;
  field->type_ = *field_->type;
  field->offset_ = field_->offset; // annotate node with offset value
}